

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Add_FullHelper
              (Var primLeft,Var primRight,ScriptContext *scriptContext,JavascriptNumber *result,
              bool leftIsDead)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptString *pJVar5;
  JavascriptString *pstRight;
  RecyclableObject *pRVar6;
  Var pvVar7;
  Type TVar8;
  double value;
  Type TStack_50;
  
  if (primLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00991d4c;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(primLeft);
  if (bVar2) {
    TVar8 = TypeIds_FirstNumberType;
  }
  else if ((ulong)primLeft >> 0x32 == 0) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(primLeft);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00991d4c;
      *puVar4 = 0;
    }
    TVar8 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00991d4c;
      *puVar4 = 0;
    }
  }
  else {
    TVar8 = TypeIds_Number;
  }
  if (primRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00991d4c;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(primRight);
  if (bVar2) {
    TStack_50 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)primRight >> 0x32 != 0) {
      TStack_50 = TypeIds_Number;
      goto LAB_00991ab7;
    }
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(primRight);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00991d4c;
      *puVar4 = 0;
    }
    TStack_50 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TStack_50) && (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00991d4c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
LAB_00991ab7:
  if ((TVar8 == TypeIds_BigInt) || (TStack_50 == TypeIds_BigInt)) {
    if (TStack_50 != TVar8) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fff3,L"Add BigInt");
    }
    pvVar7 = JavascriptBigInt::Add(primLeft,primRight);
    return pvVar7;
  }
  if (TVar8 == TypeIds_String) {
    pJVar5 = UnsafeVarTo<Js::JavascriptString>(primLeft);
    if (TStack_50 == TypeIds_String) {
      pstRight = UnsafeVarTo<Js::JavascriptString>(primRight);
    }
    else {
      pstRight = JavascriptConversion::ToString(primRight,scriptContext);
    }
  }
  else {
    if (TStack_50 != TypeIds_String) {
      value = Add_Helper(primLeft,primRight,scriptContext);
      pvVar7 = JavascriptNumber::ToVarMaybeInPlace(value,scriptContext,result);
      return pvVar7;
    }
    pJVar5 = JavascriptConversion::ToString(primLeft,scriptContext);
    pstRight = UnsafeVarTo<Js::JavascriptString>(primRight);
  }
  if (!leftIsDead) {
    pJVar5 = JavascriptString::Concat(pJVar5,pstRight);
    return pJVar5;
  }
  pJVar5 = JavascriptString::ConcatDestructive(pJVar5,pstRight);
  return pJVar5;
}

Assistant:

Var JavascriptMath::Add_FullHelper(Var primLeft, Var primRight, ScriptContext* scriptContext, JavascriptNumber *result, bool leftIsDead)
        {
            TypeId typeLeft = JavascriptOperators::GetTypeId(primLeft);
            TypeId typeRight = JavascriptOperators::GetTypeId(primRight);
            if (typeLeft == TypeIds_BigInt || typeRight == TypeIds_BigInt)
            {
                if (typeRight != typeLeft)
                {
                    JavascriptError::ThrowTypeError(scriptContext, VBSERR_TypeMismatch, _u("Add BigInt"));
                }
                return JavascriptBigInt::Add(primLeft, primRight);
            }

            // If either side is a string, then the result is also a string
            if (typeLeft == TypeIds_String)
            {
                JavascriptString* stringLeft = UnsafeVarTo<JavascriptString>(primLeft);
                JavascriptString* stringRight = nullptr;

                if (typeRight == TypeIds_String)
                {
                    stringRight = UnsafeVarTo<JavascriptString>(primRight);
                }
                else
                {
                    stringRight = JavascriptConversion::ToString(primRight, scriptContext);
                }

                if(leftIsDead)
                {
                    return stringLeft->ConcatDestructive(stringRight);
                }
                return JavascriptString::Concat(stringLeft, stringRight);
            }

            if (typeRight == TypeIds_String)
            {
                JavascriptString* stringLeft = JavascriptConversion::ToString(primLeft, scriptContext);
                JavascriptString* stringRight = UnsafeVarTo<JavascriptString>(primRight);

                if(leftIsDead)
                {
                    return stringLeft->ConcatDestructive(stringRight);
                }
                return JavascriptString::Concat(stringLeft, stringRight);
            }

            double sum = Add_Helper(primLeft, primRight, scriptContext);
            return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
        }